

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

void __thiscall
CEPlanet::SetSemiMajorAxis_AU
          (CEPlanet *this,double semi_major_axis_au,double semi_major_axis_au_per_cent)

{
  if (0.0 < semi_major_axis_au) {
    this->semi_major_axis_au_ = semi_major_axis_au;
    this->semi_major_axis_au_per_cent_ = semi_major_axis_au_per_cent;
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "[ERROR] CEPlanet::SetSemiMajorAxis_AU() : Semi major axis must be positive!\n");
  return;
}

Assistant:

void CEPlanet::SetSemiMajorAxis_AU(double semi_major_axis_au,
                                   double semi_major_axis_au_per_cent)
{
    // Make sure the semi_major_axis is positive
    if (semi_major_axis_au <= 0.0) {
        std::cerr << "[ERROR] CEPlanet::SetSemiMajorAxis_AU() : Semi major axis must be positive!\n";
    } else {
        semi_major_axis_au_ = semi_major_axis_au ;
        semi_major_axis_au_per_cent_ = semi_major_axis_au_per_cent ;
    }
}